

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::Command::Command(Command *this,string *name,value *v)

{
  value *in_RDX;
  string *in_RSI;
  value *in_RDI;
  value *in_stack_ffffffffffffffa0;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  docopt::value::value(in_stack_ffffffffffffffa0,in_RDI);
  Argument::LeafPattern((Argument *)in_stack_ffffffffffffffa0,(string *)in_RDI,in_RDX);
  docopt::value::~value(in_RDX);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)in_RDI = &PTR_flat_00353380;
  return;
}

Assistant:

Command(std::string name, value v = value{false})
		: Argument(std::move(name), std::move(v))
		{}